

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryManager.cpp
# Opt level: O2

bool __thiscall MemoryManager::copyFrom(MemoryManager *this,void *src,uint32_t dest,uint32_t len)

{
  bool bVar1;
  ulong uVar2;
  uint32_t addr;
  
  uVar2 = 0;
  do {
    if (len == uVar2) {
LAB_001038f3:
      return len <= uVar2;
    }
    addr = dest + (int)uVar2;
    bVar1 = isAddrExist(this,addr);
    if (!bVar1) {
      dbgprintf("Data copy to invalid addr 0x%x!\n",(ulong)(dest + (int)uVar2));
      goto LAB_001038f3;
    }
    setByte(this,addr,*(uint8_t *)((long)src + uVar2),(uint32_t *)0x0);
    uVar2 = uVar2 + 1;
  } while( true );
}

Assistant:

bool MemoryManager::copyFrom(const void *src, uint32_t dest, uint32_t len) {
  for (uint32_t i = 0; i < len; ++i) {
    if (!this->isAddrExist(dest + i)) {
      dbgprintf("Data copy to invalid addr 0x%x!\n", dest + i);
      return false;
    }
    this->setByte(dest + i, ((uint8_t *)src)[i]);
  }
  return true;
}